

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

void wtree(wtree_object wt,double *inp)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  char *__dest;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  char *pcVar11;
  wtree_object pwVar12;
  long lVar13;
  char *pcVar14;
  int iVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  ulong local_38;
  
  local_38 = (ulong)wt->siglength;
  iVar10 = wt->J;
  lVar5 = (long)iVar10;
  wt->length[lVar5 + 1] = wt->siglength;
  wt->outlength = 0;
  wt->zpad = 0;
  __dest = (char *)malloc(local_38 * 8);
  if (0 < (long)local_38) {
    memcpy(__dest,inp,local_38 * 8);
  }
  iVar6 = wt->wave->lpd_len;
  iVar2 = strcmp(wt->ext,"per");
  if (iVar2 == 0) {
    if (0 < iVar10) {
      iVar6 = 2;
      uVar3 = 0;
      uVar18 = local_38;
      uVar19 = lVar5 + 0x14;
      do {
        dVar20 = ceil((double)(int)uVar18 * 0.5);
        uVar4 = (uint)dVar20;
        uVar18 = (ulong)uVar4;
        *(uint *)(wt->method + uVar19 * 4 + -0x10) = uVar4;
        uVar3 = uVar3 + iVar6 * uVar4;
        iVar6 = iVar6 * 2;
        uVar7 = uVar19 - 1;
        uVar9 = uVar19 - 0x14;
        uVar19 = uVar7;
      } while (1 < uVar9);
      wt->outlength = uVar3;
      wt->length[0] = wt->length[1];
      if (0 < iVar10) {
        lVar13 = 0;
        uVar4 = 1;
        do {
          uVar17 = *(uint *)((long)wt + (lVar5 - lVar13) * 4 + 0x50);
          uVar3 = uVar3 - uVar17 * uVar4 * 2;
          if (0 < (int)uVar4) {
            pcVar14 = wt[1].method + (long)(int)uVar7 * 8 + -0x10;
            uVar18 = (ulong)uVar4;
            pcVar16 = wt[1].method + (long)(int)uVar3 * 8 + -0x10;
            do {
              if (lVar13 == 0) {
                pwVar12 = (wtree_object)wt->wave;
                pcVar11 = __dest;
              }
              else {
                pwVar12 = (wtree_object)wt->wave;
                pcVar11 = pcVar14;
              }
              wtree_per(pwVar12,(double *)pcVar11,(int)local_38,(double *)pcVar16,uVar17,
                        (double *)(pcVar16 + (long)(int)uVar17 * 8));
              pcVar16 = pcVar16 + (long)(int)(uVar17 * 2) * 8;
              pcVar14 = pcVar14 + (long)(int)local_38 * 8;
              uVar18 = uVar18 - 1;
            } while (uVar18 != 0);
            uVar17 = *(uint *)((long)wt + (lVar5 - lVar13) * 4 + 0x50);
          }
          local_38 = (ulong)uVar17;
          lVar13 = lVar13 + 1;
          uVar7 = (ulong)uVar3;
          uVar4 = uVar4 * 2;
        } while (lVar13 != lVar5);
      }
      goto LAB_00103dc1;
    }
  }
  else {
    iVar2 = strcmp(wt->ext,"sym");
    if (iVar2 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    if (0 < iVar10) {
      iVar2 = 2;
      uVar7 = 0;
      uVar18 = local_38;
      uVar19 = lVar5 + 0x14;
      do {
        dVar20 = ceil((double)((int)uVar18 + iVar6 + -2) * 0.5);
        uVar3 = (uint)dVar20;
        uVar18 = (ulong)uVar3;
        *(uint *)(wt->method + uVar19 * 4 + -0x10) = uVar3;
        uVar3 = (int)uVar7 + iVar2 * uVar3;
        uVar7 = (ulong)uVar3;
        iVar2 = iVar2 * 2;
        uVar9 = uVar19 - 1;
        uVar8 = uVar19 - 0x14;
        uVar19 = uVar9;
      } while (1 < uVar8);
      wt->outlength = uVar3;
      wt->length[0] = wt->length[1];
      if (0 < iVar10) {
        lVar13 = 0;
        uVar3 = 1;
        do {
          uVar4 = *(uint *)((long)wt + (lVar5 - lVar13) * 4 + 0x50);
          uVar17 = (int)uVar7 - uVar4 * uVar3 * 2;
          if (0 < (int)uVar3) {
            pcVar14 = wt[1].method + (long)(int)uVar9 * 8 + -0x10;
            uVar18 = (ulong)uVar3;
            pcVar16 = wt[1].method + (long)(int)uVar17 * 8 + -0x10;
            do {
              if (lVar13 == 0) {
                pwVar12 = (wtree_object)wt->wave;
                pcVar11 = __dest;
              }
              else {
                pwVar12 = (wtree_object)wt->wave;
                pcVar11 = pcVar14;
              }
              wtree_sym(pwVar12,(double *)pcVar11,(int)local_38,(double *)pcVar16,uVar4,
                        (double *)(pcVar16 + (long)(int)uVar4 * 8));
              pcVar16 = pcVar16 + (long)(int)(uVar4 * 2) * 8;
              pcVar14 = pcVar14 + (long)(int)local_38 * 8;
              uVar18 = uVar18 - 1;
            } while (uVar18 != 0);
            uVar4 = *(uint *)((long)wt + (lVar5 - lVar13) * 4 + 0x50);
          }
          local_38 = (ulong)uVar4;
          uVar9 = (ulong)uVar17;
          lVar13 = lVar13 + 1;
          uVar7 = uVar9;
          uVar3 = uVar3 * 2;
        } while (lVar13 != lVar5);
      }
      goto LAB_00103dc1;
    }
  }
  wt->length[0] = wt->length[1];
LAB_00103dc1:
  uVar18 = (ulong)(uint)wt->J;
  if (wt->J < 1) {
    *wt->coeflength = wt->siglength;
  }
  else {
    iVar6 = wt->outlength + wt->length[uVar18] * -2;
    piVar1 = wt->nodelength;
    iVar10 = 2;
    uVar19 = 0;
    iVar2 = 0;
    do {
      lVar13 = (long)iVar2;
      iVar2 = iVar10 + (uint)(iVar10 == 0) + iVar2;
      lVar5 = 0;
      iVar15 = iVar6;
      do {
        piVar1[lVar13 + lVar5] = iVar15;
        iVar15 = iVar15 + *(int *)((long)wt + (uVar18 - uVar19) * 4 + 0x50);
        lVar5 = lVar5 + 1;
      } while (iVar10 + (uint)(iVar10 == 0) != (int)lVar5);
      iVar10 = iVar10 * 2;
      iVar6 = iVar6 - wt->length[~uVar19 + uVar18] * iVar10;
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar18);
    piVar1 = wt->coeflength;
    *piVar1 = wt->siglength;
    lVar5 = uVar18 + 1;
    lVar13 = 1;
    do {
      piVar1[lVar13] = wt->length[(int)uVar18];
      lVar13 = lVar13 + 1;
      uVar18 = (ulong)((int)uVar18 - 1);
    } while (lVar5 != lVar13);
  }
  free(__dest);
  return;
}

Assistant:

void wtree(wtree_object wt,const double *inp) {
	int i,J,temp_len,iter,N,lp,p2,k,N2,Np;
	int len_cA,t,t2,it1;
	double *orig;

	temp_len = wt->siglength;
	J = wt->J;
	wt->length[J + 1] = temp_len;
	wt->outlength = 0;
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	/*
	if ((temp_len % 2) == 0) {
		wt->zpad = 0;
		orig = (double*)malloc(sizeof(double)* temp_len);
	}
	else {
		wt->zpad = 1;
		temp_len++;
		orig = (double*)malloc(sizeof(double)* temp_len);
	}
	*/
	for (i = 0; i < wt->siglength; ++i) {
		orig[i] = inp[i];
	}

	if (wt->zpad == 1) {
		orig[temp_len - 1] = orig[temp_len - 2];
	}

	N = temp_len;
	lp = wt->wave->lpd_len;
        p2 = 1;

	if (!strcmp(wt->ext,"per")) {
		i = J;
                p2 = 2;
		while (i > 0) {
			N = (int)ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += p2 * (wt->length[i]);
			i--;
                        p2 *= 2;
		}
		wt->length[0] = wt->length[1];

		N2 = N = wt->outlength;
                p2 = 1;
		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
                        N2 -= 2 * p2 * len_cA;
                        N = N2;
                        for(k = 0; k < p2;++k) {
                            if (iter == 0) {
                               wtree_per(wt, orig, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            } else {
                                wtree_per(wt, wt->params + Np + k * temp_len, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            }
                            N += 2 * len_cA;
                        }

			temp_len = wt->length[J - iter];
			p2 = 2 * p2;
            Np = N2;
		}
	}
	else if (!strcmp(wt->ext,"sym")) {
		//printf("\n YES %s \n", wt->ext);
		i = J;
                p2 = 2;
		while (i > 0) {
			N = N + lp - 2;
			N = (int) ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += p2 * (wt->length[i]);
			i--;
                        p2 *= 2;
		}
		wt->length[0] = wt->length[1];

		N2 = N = wt->outlength;
                p2 = 1;

                for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
                        N2 -= 2 * p2 * len_cA;
                        N = N2;
                        for(k = 0; k < p2;++k) {
                            if (iter == 0) {
                                wtree_sym(wt, orig, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            } else {
                                wtree_sym(wt, wt->params + Np + k * temp_len, temp_len, wt->params + N, len_cA, wt->params + N + len_cA);
                            }
                            N += 2 * len_cA;
                        }

			temp_len = wt->length[J - iter];
			p2 = 2 * p2;
            Np = N2;
		}

	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}

	J = wt->J;
	t2 = wt->outlength - 2 * wt->length[J];
	p2 = 2;
	it1 = 0;
	for (i = 0; i < J; ++i) {
		t = t2;
		for (k = 0; k < p2; ++k) {
			wt->nodelength[it1] = t;
			it1++;
			t += wt->length[J - i];
		}
		p2 *= 2;
		t2 = t2 - p2 * wt->length[J - i - 1];
	}

	wt->coeflength[0] = wt->siglength;

	for (i = 1; i < J + 1; ++i) {
		wt->coeflength[i] = wt->length[J - i + 1];
	}

	free(orig);
}